

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O3

TCGArg do_constant_folding_cond2(TCGArg *p1,TCGArg *p2,TCGCond c)

{
  char *pcVar1;
  _Bool _Var2;
  ulong y;
  TCGArg *in_RCX;
  undefined4 in_register_00000014;
  TCGArg *pTVar3;
  TCGCond in_R8D;
  TCGArg *pTVar4;
  
  pTVar3 = (TCGArg *)CONCAT44(in_register_00000014,c);
  pcVar1 = (char *)pTVar3[6];
  if ((*pcVar1 == '\x01') && (*(char *)in_RCX[6] == '\x01')) {
    y = *(long *)((char *)in_RCX[6] + 0x18) << 0x20 | (ulong)*(uint *)(pcVar1 + 0x18);
    if ((*(char *)p1[6] == '\x01') && (*(char *)p2[6] == '\x01')) {
      _Var2 = do_constant_folding_cond_64
                        (*(long *)((char *)p2[6] + 0x18) << 0x20 |
                         (ulong)*(uint *)((char *)p1[6] + 0x18),y,in_R8D);
      goto LAB_00d4a9f5;
    }
    if (y == 0) {
      if (in_R8D == TCG_COND_LTU) {
        return 0;
      }
      if (in_R8D == TCG_COND_GEU) {
        return 1;
      }
    }
  }
  if (p1 != pTVar3) {
    pTVar4 = *(TCGArg **)(p1[6] + 0x10);
    if (pTVar4 == p1) {
      return 2;
    }
    if (*(TCGArg **)(pcVar1 + 0x10) == pTVar3) {
      return 2;
    }
    while (pTVar4 != pTVar3) {
      pTVar4 = *(TCGArg **)(pTVar4[6] + 0x10);
      if (pTVar4 == p1) {
        return 2;
      }
    }
  }
  if (p2 != in_RCX) {
    pTVar3 = *(TCGArg **)(p2[6] + 0x10);
    if (pTVar3 == p2) {
      return 2;
    }
    if (*(TCGArg **)(in_RCX[6] + 0x10) == in_RCX) {
      return 2;
    }
    while (pTVar3 != in_RCX) {
      pTVar3 = *(TCGArg **)(pTVar3[6] + 0x10);
      if (pTVar3 == p2) {
        return 2;
      }
    }
  }
  _Var2 = do_constant_folding_cond_eq(in_R8D);
LAB_00d4a9f5:
  return (ulong)_Var2;
}

Assistant:

static TCGArg do_constant_folding_cond2(TCGArg *p1, TCGArg *p2, TCGCond c)
{
    TCGArg al = p1[0], ah = p1[1];
    TCGArg bl = p2[0], bh = p2[1];

    if (arg_is_const(bl) && arg_is_const(bh)) {
        tcg_target_ulong blv = arg_info(bl)->val;
        tcg_target_ulong bhv = arg_info(bh)->val;
        uint64_t b = deposit64(blv, 32, 32, bhv);

        if (arg_is_const(al) && arg_is_const(ah)) {
            tcg_target_ulong alv = arg_info(al)->val;
            tcg_target_ulong ahv = arg_info(ah)->val;
            uint64_t a = deposit64(alv, 32, 32, ahv);
            return do_constant_folding_cond_64(a, b, c);
        }
        if (b == 0) {
            switch (c) {
            case TCG_COND_LTU:
                return 0;
            case TCG_COND_GEU:
                return 1;
            default:
                break;
            }
        }
    }
    if (args_are_copies(al, bl) && args_are_copies(ah, bh)) {
        return do_constant_folding_cond_eq(c);
    }
    return 2;
}